

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O3

qint64 __thiscall QDateTime::toMSecsSinceEpoch(QDateTime *this)

{
  QDateTimePrivate *pQVar1;
  char cVar2;
  bool bVar3;
  undefined1 *millis;
  QFlagsStorage<QDateTimePrivate::TransitionOption> resolve;
  long in_FS_OFFSET;
  undefined1 local_28 [16];
  undefined1 *local_18;
  long local_10;
  uint uVar4;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d;
  uVar4 = (uint)pQVar1;
  cVar2 = (char)pQVar1;
  if (((ulong)pQVar1 & 1) == 0) {
    uVar4 = (pQVar1->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
            super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
  }
  if ((~uVar4 & 6) == 0) {
    millis = (undefined1 *)((long)pQVar1 >> 8);
    switch(uVar4 >> 4 & 3) {
    case 0:
      if ((uVar4 & 1) != 0) {
        if (((ulong)pQVar1 & 1) == 0) {
          cVar2 = (char)(pQVar1->m_status).
                        super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                        super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
        }
        resolve.i = 0x424;
        if (-1 < cVar2) {
          resolve.i = 0x442;
        }
        local_18 = &DAT_aaaaaaaaaaaaaaaa;
        local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        if (((ulong)pQVar1 & 1) == 0) {
          millis = (undefined1 *)pQVar1->m_msecs;
        }
        QDateTimePrivate::localStateAtMillis
                  ((ZoneState *)local_28,(qint64)millis,(TransitionOptions)resolve.i);
        millis = (undefined1 *)(local_28._0_8_ + (long)(int)local_28._8_4_ * -1000);
        break;
      }
    case 2:
      millis = (undefined1 *)((long)pQVar1->m_offsetFromUtc * -1000 + pQVar1->m_msecs);
      break;
    case 1:
      if (((ulong)pQVar1 & 1) == 0) {
        millis = (undefined1 *)pQVar1->m_msecs;
      }
      break;
    case 3:
      bVar3 = QTimeZone::isValid(&pQVar1->m_timeZone);
      if (bVar3) {
        millis = (undefined1 *)
                 ((long)((this->d).d)->m_offsetFromUtc * -1000 + ((this->d).d)->m_msecs);
        break;
      }
      goto LAB_00348c45;
    }
  }
  else {
LAB_00348c45:
    millis = (undefined1 *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return (qint64)millis;
}

Assistant:

qint64 QDateTime::toMSecsSinceEpoch() const
{
    // Note: QDateTimeParser relies on this producing a useful result, even when
    // !isValid(), at least when the invalidity is a time in a fall-back (that
    // we'll have adjusted to lie outside it, but marked invalid because it's
    // not what was asked for). Other things may be doing similar. But that's
    // only relevant when we got enough data for resolution to find it invalid.
    const auto status = getStatus(d);
    if (!status.testFlags(QDateTimePrivate::ValidDate | QDateTimePrivate::ValidTime))
        return 0;

    switch (extractSpec(status)) {
    case Qt::UTC:
        return getMSecs(d);

    case Qt::OffsetFromUTC:
        Q_ASSERT(!d.isShort());
        return d->m_msecs - d->m_offsetFromUtc * MSECS_PER_SEC;

    case Qt::LocalTime:
        if (status.testFlag(QDateTimePrivate::ShortData)) {
            // Short form has nowhere to cache the offset, so recompute.
            const auto resolve = toTransitionOptions(extractDaylightStatus(getStatus(d)));
            const auto state = QDateTimePrivate::localStateAtMillis(getMSecs(d), resolve);
            return state.when - state.offset * MSECS_PER_SEC;
        }
        // Use the offset saved by refreshZonedDateTime() on creation.
        return d->m_msecs - d->m_offsetFromUtc * MSECS_PER_SEC;

    case Qt::TimeZone:
        Q_ASSERT(!d.isShort());
#if QT_CONFIG(timezone)
        // Use offset refreshZonedDateTime() saved on creation:
        if (d->m_timeZone.isValid())
            return d->m_msecs - d->m_offsetFromUtc * MSECS_PER_SEC;
#endif
        return 0;
    }
    Q_UNREACHABLE_RETURN(0);
}